

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O0

void __thiscall
pbrt::BDPTIntegrator::BDPTIntegrator
          (BDPTIntegrator *this,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,int maxDepth,
          bool visualizeStrategies,bool visualizeWeights,string *lightSampleStrategy,bool regularize
          )

{
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *pvVar1;
  undefined8 *in_RDI;
  undefined4 in_R9D;
  byte in_stack_00000008;
  byte in_stack_00000010;
  string *in_stack_00000018;
  byte in_stack_00000020;
  PowerLightSampler *in_stack_00000098;
  Allocator in_stack_000000a0;
  span<const_pbrt::LightHandle> in_stack_000000a8;
  PowerLightSampler *in_stack_ffffffffffffff18;
  SamplerHandle *in_stack_ffffffffffffff20;
  polymorphic_allocator<std::byte> *this_00;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffff30;
  span<const_pbrt::LightHandle> *this_01;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffff90;
  PrimitiveHandle *in_stack_ffffffffffffff98;
  SamplerHandle *in_stack_ffffffffffffffa0;
  CameraHandle *in_stack_ffffffffffffffa8;
  RayIntegrator *in_stack_ffffffffffffffb0;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_48;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  undefined4 local_2c;
  
  local_2d = in_stack_00000008 & 1;
  local_2e = in_stack_00000010 & 1;
  local_2f = in_stack_00000020 & 1;
  local_2c = in_R9D;
  CameraHandle::CameraHandle
            ((CameraHandle *)in_stack_ffffffffffffff20,(CameraHandle *)in_stack_ffffffffffffff18);
  SamplerHandle::SamplerHandle(in_stack_ffffffffffffff20,(SamplerHandle *)in_stack_ffffffffffffff18)
  ;
  pvVar1 = &local_48;
  PrimitiveHandle::PrimitiveHandle
            ((PrimitiveHandle *)in_stack_ffffffffffffff20,
             (PrimitiveHandle *)in_stack_ffffffffffffff18);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             &stack0xffffffffffffffa0,pvVar1);
  RayIntegrator::RayIntegrator
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
            (in_stack_ffffffffffffff30);
  *in_RDI = &PTR__BDPTIntegrator_0350e660;
  *(undefined4 *)(in_RDI + 0xd) = local_2c;
  *(byte *)((long)in_RDI + 0x6c) = local_2d & 1;
  *(byte *)((long)in_RDI + 0x6d) = local_2e & 1;
  this_01 = (span<const_pbrt::LightHandle> *)(in_RDI + 0xe);
  std::__cxx11::string::string((string *)this_01,in_stack_00000018);
  *(byte *)(in_RDI + 0x12) = local_2f & 1;
  this_00 = (polymorphic_allocator<std::byte> *)(in_RDI + 0x13);
  pvVar1 = (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)operator_new(0x70);
  pstd::span<pbrt::LightHandle_const>::
  span<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>,void,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>>
            (this_01,pvVar1);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(this_00);
  PowerLightSampler::PowerLightSampler(in_stack_00000098,in_stack_000000a8,in_stack_000000a0);
  LightSamplerHandle::TaggedPointer<pbrt::PowerLightSampler>
            ((LightSamplerHandle *)this_00,in_stack_ffffffffffffff18);
  std::vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>::vector
            ((vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *)0x80d74c);
  return;
}

Assistant:

BDPTIntegrator(CameraHandle camera, SamplerHandle sampler, PrimitiveHandle aggregate,
                   std::vector<LightHandle> lights, int maxDepth,
                   bool visualizeStrategies, bool visualizeWeights,
                   const std::string &lightSampleStrategy = "power",
                   bool regularize = false)
        : RayIntegrator(camera, sampler, aggregate, lights),
          maxDepth(maxDepth),
          visualizeStrategies(visualizeStrategies),
          visualizeWeights(visualizeWeights),
          lightSampleStrategy(lightSampleStrategy),
          lightSampler(new PowerLightSampler(lights, Allocator())),
          regularize(regularize) {}